

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

void __thiscall ObjectFile::store(ObjectFile *this,bool isCommit)

{
  pointer pcVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  MutexLocker lock;
  File objectFile;
  File lockFile;
  MutexLocker local_e0;
  string local_d0;
  string local_b0;
  File local_90;
  File local_58;
  
  if (((int)CONCAT71(in_register_00000031,isCommit) == 0) && (this->inTransaction != false)) {
    return;
  }
  if (this->valid == false) {
    softHSMLog(7,"store",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x2a0,"Cannot write back an invalid object %s",(this->path)._M_dataplus._M_p);
    return;
  }
  pcVar1 = (this->path)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (this->path)._M_string_length);
  File::File(&local_90,&local_b0,this->umask,true,true,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  bVar2 = File::isValid(&local_90);
  if (bVar2) {
    File::lock(&local_90,true);
    if (isCommit) {
      bVar2 = writeAttributes(this,&local_90);
      if (!bVar2) goto LAB_00133f42;
    }
    else {
      MutexLocker::MutexLocker(&local_e0,this->objectMutex);
      pcVar1 = (this->lockpath)._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + (this->lockpath)._M_string_length);
      File::File(&local_58,&local_d0,this->umask,false,true,true,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      bVar2 = writeAttributes(this,&local_90);
      if (!bVar2) {
        this->valid = false;
        File::~File(&local_58);
        MutexLocker::~MutexLocker(&local_e0);
        goto LAB_00133fff;
      }
      File::~File(&local_58);
      MutexLocker::~MutexLocker(&local_e0);
    }
    this->valid = true;
  }
  else {
    softHSMLog(7,"store",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x2a9,"Cannot open object %s for writing",(this->path)._M_dataplus._M_p);
LAB_00133f42:
    this->valid = false;
  }
LAB_00133fff:
  File::~File(&local_90);
  return;
}

Assistant:

void ObjectFile::store(bool isCommit /* = false */)
{
	// Check if we're in the middle of a transaction
	if (!isCommit && inTransaction)
	{
		return;
	}

	if (!valid)
	{
		DEBUG_MSG("Cannot write back an invalid object %s", path.c_str());

		return;
	}

	File objectFile(path, umask, true, true, true, false);

	if (!objectFile.isValid())
	{
		DEBUG_MSG("Cannot open object %s for writing", path.c_str());

		valid = false;

		return;
	}

	objectFile.lock();

	if (!isCommit) {
		MutexLocker lock(objectMutex);
		File lockFile(lockpath, umask, false, true, true);

		if (!writeAttributes(objectFile))
		{
			valid = false;

			return;
		}
	}
	else
	{
		if (!writeAttributes(objectFile))
		{
			valid = false;

			return;
		}
	}

	valid = true;
}